

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test::TestBody
          (RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test *this)

{
  RepeatedField<int> *this_00;
  void *ptr;
  int j;
  int value;
  char *message;
  int i;
  int iVar1;
  undefined1 auVar2 [16];
  AssertionResult gtest_ar;
  vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  values;
  Arena arena;
  AssertHelper local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  long local_110;
  ThreadSafeArena *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined8 *local_f8;
  long lStack_f0;
  long local_e8;
  ThreadSafeArena local_d8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_d8);
  local_f8 = (undefined8 *)0x0;
  lStack_f0 = 0;
  local_e8 = 0;
  iVar1 = 0;
  do {
    ptr = Arena::Allocate((Arena *)&local_d8,0x10);
    local_108 = &local_d8;
    local_118._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
         Construct<google::protobuf::Arena*>(ptr,(Arena **)&local_108);
    std::
    vector<google::protobuf::RepeatedField<int>*,std::allocator<google::protobuf::RepeatedField<int>*>>
    ::emplace_back<google::protobuf::RepeatedField<int>*>
              ((vector<google::protobuf::RepeatedField<int>*,std::allocator<google::protobuf::RepeatedField<int>*>>
                *)&local_f8,(RepeatedField<int> **)&local_118);
    this_00 = *(RepeatedField<int> **)(lStack_f0 + -8);
    value = 0;
    do {
      RepeatedField<int>::Add(this_00,value);
      value = value + 1;
    } while (value != 1000);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 100);
  local_110 = 2;
  if ((*(byte *)*local_f8 & 4) != 0) {
    local_110 = (long)*(int *)((byte *)*local_f8 + 0xc);
  }
  local_110 = (lStack_f0 - (long)local_f8 >> 1) * local_110;
  auVar2._8_4_ = (int)((ulong)local_110 >> 0x20);
  auVar2._0_8_ = local_110;
  auVar2._12_4_ = 0x45300000;
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((auVar2._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)local_110) - 4503599627370496.0)) * 1.02);
  local_120.data_ = (AssertHelperData *)protobuf::internal::ThreadSafeArena::SpaceUsed(&local_d8);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<unsigned_long>,testing::internal::LeMatcher<double>>>
  ::operator()(&local_108,(char *)&local_118,(unsigned_long *)"arena.SpaceUsed()");
  if ((char)local_108 == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xf5,message);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  if (local_f8 != (undefined8 *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
  return;
}

Assistant:

TEST(RepeatedField, NaturalGrowthOnArenasReuseBlocks) {
  Arena arena;
  std::vector<RepeatedField<int>*> values;

  static constexpr int kNumFields = 100;
  static constexpr int kNumElems = 1000;
  for (int i = 0; i < kNumFields; ++i) {
    values.push_back(Arena::Create<RepeatedField<int>>(&arena));
    auto& field = *values.back();
    for (int j = 0; j < kNumElems; ++j) {
      field.Add(j);
    }
  }

  size_t expected = values.size() * values[0]->Capacity() * sizeof(int);
  // Use a 2% slack for other overhead. If we were not reusing the blocks, the
  // actual value would be ~2x the expected.
  EXPECT_THAT(arena.SpaceUsed(), AllOf(Ge(expected), Le(1.02 * expected)));
}